

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O0

pair<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value>::iterator,_bool>
* __thiscall
google::protobuf::Map<std::__cxx11::string,google::protobuf::Value>::
try_emplace<std::basic_string_view<char,std::char_traits<char>>>
          (pair<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value>::iterator,_bool>
           *__return_storage_ptr__,Map<std::__cxx11::string,google::protobuf::Value> *this,
          basic_string_view<char,_std::char_traits<char>_> *k)

{
  basic_string_view<char,_std::char_traits<char>_> *k_local;
  Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value>
  *this_local;
  
  ArenaAwareTryEmplace<std::basic_string_view<char,std::char_traits<char>>>
            (__return_storage_ptr__,this,k);
  return __return_storage_ptr__;
}

Assistant:

std::pair<iterator, bool> try_emplace(K&& k, Args&&... args)
      ABSL_ATTRIBUTE_LIFETIME_BOUND {
    // Inserts a new element into the container if there is no element with the
    // key in the container.
    // The new element is:
    //  (1) Constructed in-place with the given args, if mapped_type is not
    //      arena constructible.
    //  (2) Constructed in-place with the arena and then assigned with a
    //      mapped_type temporary constructed with the given args, otherwise.
    return ArenaAwareTryEmplace(Arena::is_arena_constructable<mapped_type>(),
                                std::forward<K>(k),
                                std::forward<Args>(args)...);
  }